

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.h
# Opt level: O3

void deqp::gles3::Functional::eval_allEqual_ivec2(ShaderEvalContext *c)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_4 = (int)c->in[0].m_data[3];
  local_8 = (int)c->in[0].m_data[1];
  local_c = (int)c->in[1].m_data[1];
  local_10 = (int)c->in[1].m_data[0];
  bVar5 = true;
  piVar3 = &local_4;
  piVar4 = &local_c;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if (bVar5) {
      bVar5 = *piVar3 == *piVar4;
    }
    else {
      bVar5 = false;
    }
    piVar3 = &local_8;
    piVar4 = &local_10;
    bVar1 = false;
  } while (bVar2);
  (c->color).m_data[0] = (float)bVar5;
  return;
}

Assistant:

DE_INLINE deInt32	deChopFloatToInt32	(float x)					{ return (deInt32)x; }